

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTypeCheckerVisitor.cpp
# Opt level: O0

void __thiscall CTypeCheckerVisitor::Visit(CTypeCheckerVisitor *this,CWhileStm *stm)

{
  bool bVar1;
  pointer pIVar2;
  pointer pIVar3;
  CError local_148;
  TypeInfo local_118;
  CError local_f0;
  TypeInfo local_c0;
  TypeInfo local_98;
  undefined1 local_70 [8];
  string errorMessage;
  TypeInfo local_40;
  CWhileStm *local_18;
  CWhileStm *stm_local;
  CTypeCheckerVisitor *this_local;
  
  local_18 = stm;
  stm_local = (CWhileStm *)this;
  std::operator<<((ostream *)&std::cout,"typechecker: CWhileStm\n");
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_18->conditionExpression);
  if ((bVar1) &&
     (bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&local_18->statement), bVar1)) {
    pIVar2 = std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::operator->
                       (&local_18->conditionExpression);
    (**(pIVar2->super_PositionedNode).super_INode._vptr_INode)(pIVar2,this);
    TypeInfo::TypeInfo(&local_40,ERROR_TYPE);
    bVar1 = ::operator==(&this->lastCalculatedType,&local_40);
    TypeInfo::~TypeInfo(&local_40);
    if (!bVar1) {
      if ((this->lastCalculatedType).type == BOOLEAN) {
        pIVar3 = std::unique_ptr<IStatement,_std::default_delete<IStatement>_>::operator->
                           (&local_18->statement);
        (**(pIVar3->super_PositionedNode).super_INode._vptr_INode)(pIVar3,this);
        TypeInfo::TypeInfo(&local_118,VOID);
        TypeInfo::operator=(&this->lastCalculatedType,&local_118);
        TypeInfo::~TypeInfo(&local_118);
      }
      else {
        TypeInfo::TypeInfo(&local_98,BOOLEAN);
        TypeInfo::TypeInfo(&local_c0,(this->lastCalculatedType).type);
        CError::GetTypeErrorMessage_abi_cxx11_((CError *)local_70,&local_98,&local_c0);
        TypeInfo::~TypeInfo(&local_c0);
        TypeInfo::~TypeInfo(&local_98);
        CError::CError(&local_f0,(string *)local_70,
                       &(local_18->super_IStatement).super_PositionedNode.position);
        std::vector<CError,_std::allocator<CError>_>::push_back(&this->errors,&local_f0);
        CError::~CError(&local_f0);
        std::__cxx11::string::~string((string *)local_70);
      }
    }
  }
  else {
    CError::CError(&local_148,(string *)CError::AST_ERROR_abi_cxx11_,
                   &(local_18->super_IStatement).super_PositionedNode.position);
    std::vector<CError,_std::allocator<CError>_>::push_back(&this->errors,&local_148);
    CError::~CError(&local_148);
  }
  return;
}

Assistant:

void CTypeCheckerVisitor::Visit( CWhileStm &stm ) 
{
    std::cout << "typechecker: CWhileStm\n";

    if( stm.conditionExpression && stm.statement ) {
		stm.conditionExpression->Accept( *this );
        if( lastCalculatedType == enums::TPrimitiveType::ERROR_TYPE ) {
            return;
        }
		if( lastCalculatedType.type != enums::TPrimitiveType::BOOLEAN ) {
			auto errorMessage = CError::GetTypeErrorMessage( TypeInfo( enums::TPrimitiveType::BOOLEAN), lastCalculatedType.type );
			errors.push_back( CError( errorMessage, stm.position ) );
            return;
		}
        stm.statement->Accept( *this );
        lastCalculatedType = enums::TPrimitiveType::VOID;
    } else {
        errors.push_back( CError( CError::AST_ERROR, stm.position ) );
	}
}